

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::call
          (action_provider<clipp::parameter> *this,simple_action *a)

{
  _Manager_type p_Var1;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  function<void_(const_char_*)> local_28;
  
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = a->_M_invoker;
  p_Var1 = (a->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(a->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(a->super__Function_base)._M_functor + 8);
    (a->super__Function_base)._M_manager = (_Manager_type)0x0;
    a->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  std::function<void(char_const*)>::
  function<clipp::detail::action_provider<clipp::parameter>::simple_action_adapter,void>
            ((function<void(char_const*)> *)&local_28,(simple_action_adapter *)&local_48);
  std::vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>::
  emplace_back<std::function<void(char_const*)>>
            ((vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>
              *)this,&local_28);
  std::_Function_base::~_Function_base(&local_28.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return (parameter *)
         &this[-1].blockedActions_.
          super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

Derived&
    call(simple_action a) {
        argActions_.push_back(simple_action_adapter(std::move(a)));
        return *static_cast<Derived*>(this);
    }